

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_distance.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_51db8::lower_distance_visitor::is_distance_vec8
          (lower_distance_visitor *this,ir_rvalue *ir)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if ((ir->type->field_0x4 == '\x11') && ((ir->type->fields).array == &glsl_type::_float_type)) {
    if ((this->old_distance_out_var != (ir_variable *)0x0) &&
       (iVar1 = (*(ir->super_ir_instruction)._vptr_ir_instruction[8])(ir),
       (ir_variable *)CONCAT44(extraout_var,iVar1) == this->old_distance_out_var)) {
      return true;
    }
    if (this->old_distance_in_var != (ir_variable *)0x0) {
      if (3 < (uint)(this->shader_stage + MESA_SHADER_NONE)) {
        __assert_fail("this->shader_stage == MESA_SHADER_TESS_CTRL || this->shader_stage == MESA_SHADER_TESS_EVAL || this->shader_stage == MESA_SHADER_GEOMETRY || this->shader_stage == MESA_SHADER_FRAGMENT"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_distance.cpp"
                      ,0x138,
                      "bool (anonymous namespace)::lower_distance_visitor::is_distance_vec8(ir_rvalue *)"
                     );
      }
      iVar1 = (*(ir->super_ir_instruction)._vptr_ir_instruction[8])(ir);
      if ((ir_variable *)CONCAT44(extraout_var_00,iVar1) == this->old_distance_in_var) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
lower_distance_visitor::is_distance_vec8(ir_rvalue *ir)
{
   /* Note that geometry shaders contain gl_ClipDistance both as an input
    * (which is a 2D array) and an output (which is a 1D array), so it's
    * possible for both this->old_distance_out_var and
    * this->old_distance_in_var to be non-NULL in the same shader.
    */

   if (!ir->type->is_array())
      return false;
   if (ir->type->fields.array != glsl_type::float_type)
      return false;

   if (this->old_distance_out_var) {
      if (ir->variable_referenced() == this->old_distance_out_var)
         return true;
   }
   if (this->old_distance_in_var) {
      assert(this->shader_stage == MESA_SHADER_TESS_CTRL ||
             this->shader_stage == MESA_SHADER_TESS_EVAL ||
             this->shader_stage == MESA_SHADER_GEOMETRY ||
             this->shader_stage == MESA_SHADER_FRAGMENT);

      if (ir->variable_referenced() == this->old_distance_in_var)
         return true;
   }
   return false;
}